

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::error(Parser *this,string *message)

{
  ostream *poVar1;
  Token *this_00;
  logic_error *this_01;
  string sStack_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"PARSE ERROR!");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1," ");
  poVar1 = std::operator<<((ostream *)&std::cout,"Current token: ");
  this_00 = Lexer::current_token(this->lex);
  Token::get_lexeme_abi_cxx11_(&sStack_38,this_00);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&sStack_38);
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,(string *)message);
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Parser::error(const string message)
{
	cout << "PARSE ERROR!" << message << " ";
	cout << "Current token: " << lex->current_token()->get_lexeme() << endl;

	throw logic_error(message);
}